

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

insert_return_type * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        *this,node_type *node)

{
  slot_type *psVar1;
  undefined1 auVar2 [16];
  slot_type *psVar3;
  slot_type *old_slot;
  size_t i;
  ctrl_t *pcVar4;
  size_t hashval;
  ctrl_t *pcVar5;
  slot_type *unaff_R14;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *this_00;
  pair<unsigned_long,_bool> pVar6;
  insert_return_type res;
  bool local_48;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  local_40;
  
  if ((node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ).alloc_.
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged == false) {
    (__return_storage_ptr__->position).it_end_.ctrl_ = (ctrl_t *)0x0;
    (__return_storage_ptr__->position).it_.ctrl_ = (ctrl_t *)0x0;
    (__return_storage_ptr__->position).inner_ = (Inner *)0x0;
    (__return_storage_ptr__->position).inner_end_ = (Inner *)0x0;
    __return_storage_ptr__->inserted = false;
    *(bool *)((long)&(__return_storage_ptr__->node).
                     super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                     .alloc_.
                     super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             + 1) = false;
  }
  else {
    psVar3 = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             ::slot(&node->
                     super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                   );
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*(psVar3->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
    this_00 = &(this->sets_)._M_elems
               [((uint)(hashval >> 0x18) & 0xff ^
                (uint)(hashval >> 0x10) & 0xffff ^ (uint)(hashval >> 8) & 0xffffff) & 0xf].set_;
    if ((node->
        super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ).alloc_.
        super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ._M_engaged == false) {
      pcVar5 = this_00->ctrl_ + this_00->capacity_;
      local_48 = false;
      local_40.alloc_.
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged = false;
    }
    else {
      psVar3 = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               ::slot(&node->
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                     );
      old_slot = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                 ::slot(&node->
                         super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                       );
      pVar6 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
              ::find_or_prepare_insert<std::unique_ptr<int,std::default_delete<int>>>
                        ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                          *)this_00,psVar3,hashval);
      i = pVar6.first;
      local_48 = ((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
      if (local_48) {
        pcVar5 = this_00->ctrl_;
        psVar1 = this_00->slots_;
        node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ::node_handle_base(&local_40,
                           &node->
                            super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                          );
      }
      else {
        FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>::
        transfer<std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                  ((allocator<std::unique_ptr<int,_std::default_delete<int>_>_> *)
                   &this_00->settings_,this_00->slots_ + i,old_slot);
        raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
        pcVar5 = this_00->ctrl_;
        psVar1 = this_00->slots_;
        node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ::reset(&node->
                 super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               );
        local_40.alloc_.
        super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        ._M_engaged = false;
      }
      unaff_R14 = psVar1 + i;
      pcVar5 = pcVar5 + i;
      local_48 = !local_48;
    }
    pcVar4 = this_00->ctrl_ + this_00->capacity_;
    if (pcVar4 == pcVar5) {
      (__return_storage_ptr__->position).inner_ = (Inner *)0x0;
      (__return_storage_ptr__->position).inner_end_ = (Inner *)0x0;
      (__return_storage_ptr__->position).it_.ctrl_ = (ctrl_t *)0x0;
      pcVar4 = (ctrl_t *)0x0;
    }
    else {
      (__return_storage_ptr__->position).inner_ = (Inner *)this_00;
      (__return_storage_ptr__->position).inner_end_ = (Inner *)(this + 1);
      (__return_storage_ptr__->position).it_.ctrl_ = pcVar5;
      (__return_storage_ptr__->position).it_.field_1.slot_ = unaff_R14;
    }
    (__return_storage_ptr__->position).it_end_.ctrl_ = pcVar4;
    __return_storage_ptr__->inserted = local_48;
    if (local_48 == true) {
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               + 1) = false;
    }
    else {
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ::node_handle_base(&(__return_storage_ptr__->node).
                          super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                         ,&local_40);
    }
    node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::~node_handle_base(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node) {
        if (!node) 
            return {end(), false, node_type()};
        auto& key      = node.key();
        size_t hashval = this->hash(key);
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;

        UniqueLock m(inner);
        auto   res  = set.insert(std::move(node), hashval);
        return { make_iterator(&inner, res.position),
                 res.inserted,
                 res.inserted ? node_type() : std::move(res.node) };
    }